

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_base.h
# Opt level: O3

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForDataId
          (VectorD<long,_3> *__return_storage_ptr__,
          MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
          *this,int data_id)

{
  PointAttribute *this_00;
  AttributeValueIndex att_id;
  
  this_00 = this->pos_attribute_;
  att_id.value_ = this->entry_to_point_id_map_[data_id].value_;
  if (this_00->identity_mapping_ == false) {
    att_id.value_ =
         (this_00->indices_map_).vector_.
         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_id.value_].value_;
  }
  (__return_storage_ptr__->v_)._M_elems[0] = 0;
  (__return_storage_ptr__->v_)._M_elems[1] = 0;
  (__return_storage_ptr__->v_)._M_elems[2] = 0;
  GeometryAttribute::ConvertValue<long>
            (&this_00->super_GeometryAttribute,att_id,
             (this_00->super_GeometryAttribute).num_components_,(long *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

VectorD<int64_t, 3> GetPositionForDataId(int data_id) const {
    DRACO_DCHECK(this->IsInitialized());
    const auto point_id = entry_to_point_id_map_[data_id];
    const auto pos_val_id = pos_attribute_->mapped_index(point_id);
    VectorD<int64_t, 3> pos;
    pos_attribute_->ConvertValue(pos_val_id, &pos[0]);
    return pos;
  }